

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfsUtil.h
# Opt level: O0

void __thiscall FileTree::insertNode(FileTree *this,string *value,bool isFile)

{
  bool bVar1;
  TreeNode *this_00;
  reference pvVar2;
  TreeNode *local_b0;
  TreeNode *temp;
  string local_a0 [32];
  TreeNode *local_80;
  TreeNode *newNode;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string local_50 [39];
  undefined1 local_29;
  TreeNode *pTStack_28;
  bool isFound;
  TreeNode *nodeParent;
  string *psStack_18;
  bool isFile_local;
  string *value_local;
  FileTree *this_local;
  
  pTStack_28 = this->root;
  nodeParent._7_1_ = isFile;
  psStack_18 = value;
  value_local = (string *)this;
  std::__cxx11::string::string(local_50,(string *)value);
  bVar1 = findNode(this,(string *)local_50,(bool)(nodeParent._7_1_ & 1),&stack0xffffffffffffffd8);
  std::__cxx11::string::~string(local_50);
  if (!bVar1) {
    local_29 = bVar1;
    split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&newNode,value,'/');
    this_00 = (TreeNode *)operator_new(0x40);
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&newNode);
    std::__cxx11::string::string(local_a0,(string *)pvVar2);
    TreeNode::TreeNode(this_00,(string *)local_a0,(bool)(nodeParent._7_1_ & 1));
    std::__cxx11::string::~string(local_a0);
    this_00->parent = pTStack_28;
    local_b0 = pTStack_28->firstChild;
    if (local_b0 == (TreeNode *)0x0) {
      pTStack_28->firstChild = this_00;
    }
    else {
      for (; local_b0->nextSibling != (TreeNode *)0x0; local_b0 = local_b0->nextSibling) {
      }
      local_b0->nextSibling = this_00;
    }
    local_80 = this_00;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&newNode);
  }
  return;
}

Assistant:

void insertNode(const std::string value, bool isFile)
    {
        TreeNode *nodeParent = root;

        //bool isFound = findNode(value, isFile, nodeParent);
        bool isFound = findNode(value, isFile, nodeParent);


        if (!isFound)
        {
            std::vector<std::string> files = split(value, '/');
            TreeNode* newNode = new TreeNode(files.back(), isFile);

            newNode->parent = nodeParent;

            TreeNode *temp = nodeParent->firstChild;

            if (temp == nullptr)
            {
                nodeParent->firstChild = newNode;
            }

            else
            {
                while (temp->nextSibling != nullptr)
                {
                    temp = temp->nextSibling;
                }

                temp->nextSibling = newNode;


            }
        }
    }